

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WDString.cpp
# Opt level: O3

void get_next(string *T,int *next)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  next[1] = 0;
  uVar1 = T->_M_string_length;
  if (1 < uVar1) {
    iVar3 = 1;
    iVar4 = 0;
    uVar5 = 1;
    do {
      if ((iVar4 == 0) || (pcVar2 = (T->_M_dataplus)._M_p, pcVar2[uVar5] == pcVar2[iVar4])) {
        lVar6 = (long)iVar3;
        iVar3 = iVar3 + 1;
        iVar4 = iVar4 + 1;
        next[lVar6 + 1] = iVar4;
        uVar5 = lVar6 + 1;
      }
      else {
        uVar5 = (ulong)iVar3;
        iVar4 = next[iVar4];
      }
    } while (uVar5 < uVar1);
  }
  printf("The next array is:");
  printArray(next,(int)T->_M_string_length);
  return;
}

Assistant:

void get_next(string T, int next[])
{
    int i = 1, j = 0;
    next[1] = 0;
    while(i < T.length())
    {
        if(j==0 || T[i]==T[j])
        {
            ++i; ++j;
            next[i] = j;
        }
        else j = next[j];
    }
    printf("The next array is:");
    printArray(next,T.length());
}